

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int loop(uchar *pattern,uchar *string,int maxstars)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uchar *pattern_00;
  bool local_159;
  uint local_154;
  uchar *puStack_150;
  int found;
  uchar *pp;
  uchar charset [271];
  uchar *s;
  uchar *p;
  int maxstars_local;
  uchar *string_local;
  uchar *pattern_local;
  
  unique0x1000019a = string;
  memset(&pp,0,0x10f);
  s = pattern;
  while( true ) {
    while( true ) {
      while( true ) {
        uVar1 = *s;
        if (uVar1 == '\0') {
          return (uint)(*stack0xffffffffffffffc8 != 0);
        }
        if (uVar1 == '*') {
          if (maxstars == 0) {
            return 1;
          }
          do {
            while( true ) {
              pattern_00 = s + 1;
              if (s[1] == '\0') {
                return 0;
              }
              s = pattern_00;
              if (*pattern_00 == '?') break;
              if (*pattern_00 != '*') {
                while( true ) {
                  if (*stack0xffffffffffffffc8 == 0) {
                    return 1;
                  }
                  iVar4 = loop(pattern_00,stack0xffffffffffffffc8,maxstars + -1);
                  if (iVar4 == 0) break;
                  register0x00000000 = stack0xffffffffffffffc8 + 1;
                }
                return 0;
              }
            }
            bVar2 = *stack0xffffffffffffffc8;
            unique0x100001b2 = stack0xffffffffffffffc8 + 1;
          } while (bVar2 != 0);
          return 1;
        }
        if (uVar1 != '?') break;
        if (*stack0xffffffffffffffc8 == 0) {
          return 1;
        }
        unique0x100001ca = stack0xffffffffffffffc8 + 1;
        s = s + 1;
      }
      if (uVar1 == '[') break;
      if (uVar1 == '\\') {
        if (s[1] != '\0') {
          s = s + 1;
        }
        bVar2 = *stack0xffffffffffffffc8;
        bVar3 = *s;
        unique0x100001d2 = stack0xffffffffffffffc8 + 1;
        s = s + 1;
        if (bVar2 != bVar3) {
          return 1;
        }
      }
      else {
        bVar2 = *s;
        bVar3 = *stack0xffffffffffffffc8;
        unique0x100001da = stack0xffffffffffffffc8 + 1;
        s = s + 1;
        if (bVar2 != bVar3) {
          return 1;
        }
      }
    }
    puStack_150 = s + 1;
    iVar4 = setcharset(&stack0xfffffffffffffeb0,(uchar *)&pp);
    if (iVar4 == 0) {
      return 1;
    }
    local_154 = 0;
    if (*stack0xffffffffffffffc8 == 0) break;
    if (charset[(ulong)*stack0xffffffffffffffc8 - 8] == '\0') {
      if (charset[0xf9] == '\0') {
        if (charset[0xfc] == '\0') {
          if (charset[0xfa] == '\0') {
            if (charset[0xfb] == '\0') {
              if (charset[0xfd] == '\0') {
                if (charset[0x101] == '\0') {
                  if (charset[0x102] == '\0') {
                    if (charset[0xff] == '\0') {
                      if (charset[0xfe] == '\0') {
                        if (charset[0x100] != '\0') {
                          local_154 = Curl_isgraph((uint)*stack0xffffffffffffffc8);
                        }
                      }
                      else {
                        local_159 = true;
                        if (*stack0xffffffffffffffc8 != 0x20) {
                          local_159 = *stack0xffffffffffffffc8 == 9;
                        }
                        local_154 = (uint)local_159;
                      }
                    }
                    else {
                      local_154 = Curl_islower((uint)*stack0xffffffffffffffc8);
                    }
                  }
                  else {
                    local_154 = Curl_isupper((uint)*stack0xffffffffffffffc8);
                  }
                }
                else {
                  local_154 = Curl_isspace((uint)*stack0xffffffffffffffc8);
                }
              }
              else {
                local_154 = Curl_isprint((uint)*stack0xffffffffffffffc8);
              }
            }
            else {
              local_154 = Curl_isxdigit((uint)*stack0xffffffffffffffc8);
            }
          }
          else {
            local_154 = Curl_isdigit((uint)*stack0xffffffffffffffc8);
          }
        }
        else {
          local_154 = Curl_isalpha((uint)*stack0xffffffffffffffc8);
        }
      }
      else {
        local_154 = Curl_isalnum((uint)*stack0xffffffffffffffc8);
      }
    }
    else {
      local_154 = 1;
    }
    if (charset[0xf8] != '\0') {
      local_154 = (uint)((local_154 != 0 ^ 0xffU) & 1);
    }
    if (local_154 == 0) {
      return 1;
    }
    unique0x100001c2 = stack0xffffffffffffffc8 + 1;
    s = puStack_150 + 1;
  }
  return 1;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}